

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O0

void print_type(CrispyValue value)

{
  CrispyValue value_00;
  CrispyValue value_local;
  
  value_00.field_1 = value.field_1;
  value_00.type = value.type;
  switch(value_00.type) {
  case NIL:
    printf(" : NIL\n");
    break;
  case NUMBER:
    printf(" : NUMBER\n");
    break;
  case OBJECT:
    value_00._4_4_ = 0;
    print_object_type(value_00);
    break;
  case BOOLEAN:
    printf(" : BOOLEAN\n");
  }
  return;
}

Assistant:

void print_type(CrispyValue value) {
    switch (value.type) {
        case NUMBER:
            printf(" : NUMBER\n");
            break;
        case BOOLEAN:
            printf(" : BOOLEAN\n");
            break;
        case OBJECT:
            print_object_type(value);
            break;
        case NIL:
            printf(" : NIL\n");
            break;
    }
}